

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

int Ssw_SecSpecialMiter(Aig_Man_t *p0,Aig_Man_t *p1,int nFrames,int fVerbose)

{
  int iVar1;
  Aig_Man_t *pPart0;
  Aig_Man_t *pPart1;
  char *__s;
  Aig_Man_t *local_38;
  Aig_Man_t *local_30;
  
  if (fVerbose == 0) {
    if (p1 != (Aig_Man_t *)0x0) goto LAB_0051fd17;
LAB_0051fd83:
    iVar1 = Saig_ManDemiterSimpleDiff(p0,&local_30,&local_38);
    if (iVar1 == 0) {
      __s = "Demitering has failed.";
    }
    else {
      iVar1 = local_30->nRegs;
      pPart1 = local_38;
      pPart0 = local_30;
      if (iVar1 == local_38->nRegs) goto LAB_0051fd31;
      Aig_ManStop(local_30);
      Aig_ManStop(local_38);
      __s = "After demitering AIGs have different number of flops. Quitting.";
    }
    puts(__s);
    iVar1 = -1;
  }
  else {
    puts("Performing sequential verification using combinational A/B miter.");
    if (p1 == (Aig_Man_t *)0x0) {
      Aig_ManPrintStats(p0);
      goto LAB_0051fd83;
    }
LAB_0051fd17:
    pPart0 = Aig_ManDupSimple(p0);
    pPart1 = Aig_ManDupSimple(p1);
    iVar1 = pPart0->nRegs;
LAB_0051fd31:
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(pPart0) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                    ,0x4b4,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    if (pPart1->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(pPart1) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                    ,0x4b5,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    if (pPart0->nTruePis != pPart1->nTruePis) {
      __assert_fail("Saig_ManPiNum(pPart0) == Saig_ManPiNum(pPart1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                    ,0x4b6,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    if (pPart0->nTruePos != pPart1->nTruePos) {
      __assert_fail("Saig_ManPoNum(pPart0) == Saig_ManPoNum(pPart1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                    ,0x4b7,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    if (iVar1 != pPart1->nRegs) {
      __assert_fail("Aig_ManRegNum(pPart0) == Aig_ManRegNum(pPart1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigMiter.c"
                    ,0x4b8,"int Ssw_SecSpecialMiter(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    iVar1 = Ssw_SecSpecial(pPart0,pPart1,nFrames,fVerbose);
    if (iVar1 == 1) {
      iVar1 = 1;
    }
    else if (pPart1->nObjs[6] + pPart1->nObjs[5] <= pPart0->nObjs[6] + pPart0->nObjs[5]) {
      iVar1 = Ssw_SecSpecial(pPart1,pPart0,nFrames,fVerbose);
    }
    Aig_ManStop(pPart0);
    Aig_ManStop(pPart1);
  }
  return iVar1;
}

Assistant:

int Ssw_SecSpecialMiter( Aig_Man_t * p0, Aig_Man_t * p1, int nFrames, int fVerbose )
{
    Aig_Man_t * pPart0, * pPart1;
    int RetValue;
    if ( fVerbose )
        printf( "Performing sequential verification using combinational A/B miter.\n" );
    // consider the case when a miter is given
    if ( p1 == NULL )
    {
        if ( fVerbose )
        {
            Aig_ManPrintStats( p0 );
        }
        // demiter the miter
        if ( !Saig_ManDemiterSimpleDiff( p0, &pPart0, &pPart1 ) )
        {
            printf( "Demitering has failed.\n" );
            return -1;
        }
        if ( Aig_ManRegNum(pPart0) != Aig_ManRegNum(pPart1) )
        {
            Aig_ManStop( pPart0 );
            Aig_ManStop( pPart1 );
            printf( "After demitering AIGs have different number of flops. Quitting.\n" );
            return -1;
        }
    }
    else
    {
        pPart0 = Aig_ManDupSimple( p0 );
        pPart1 = Aig_ManDupSimple( p1 );
    }
    if ( fVerbose )
    {
//        Aig_ManPrintStats( pPart0 );
//        Aig_ManPrintStats( pPart1 );
        if ( p1 == NULL )
        {
//        Aig_ManDumpBlif( pPart0, "part0.blif", NULL, NULL );
//        Aig_ManDumpBlif( pPart1, "part1.blif", NULL, NULL );
//        printf( "The result of demitering is written into files \"%s\" and \"%s\".\n", "part0.blif", "part1.blif" );
        }
    }
    assert( Aig_ManRegNum(pPart0) > 0 );
    assert( Aig_ManRegNum(pPart1) > 0 );
    assert( Saig_ManPiNum(pPart0) == Saig_ManPiNum(pPart1) );
    assert( Saig_ManPoNum(pPart0) == Saig_ManPoNum(pPart1) );
    assert( Aig_ManRegNum(pPart0) == Aig_ManRegNum(pPart1) );
    RetValue = Ssw_SecSpecial( pPart0, pPart1, nFrames, fVerbose );
    if ( RetValue != 1 && Aig_ManNodeNum(pPart0) >= Aig_ManNodeNum(pPart1) )
        RetValue = Ssw_SecSpecial( pPart1, pPart0, nFrames, fVerbose );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    return RetValue;
}